

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O1

void __thiscall
kratos::Simulator::set_value_(Simulator *this,Var *var,optional<unsigned_long> op_value)

{
  VarType VVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  pointer puVar4;
  void *pvVar5;
  ulong *puVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  const_iterator __begin5;
  undefined4 extraout_var;
  __node_base_ptr p_Var10;
  pointer puVar11;
  mapped_type *pmVar12;
  _Storage<unsigned_long,_true> *p_Var13;
  mapped_type *pmVar14;
  pair<unsigned_int,_unsigned_int> pVar15;
  UserException *pUVar16;
  InternalException *pIVar17;
  byte bVar18;
  _Storage<unsigned_long,_true> _Var19;
  ulong uVar20;
  size_type __n;
  pointer ppuVar21;
  __node_base_ptr p_Var22;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  __node_base_ptr p_Var23;
  __node_base_ptr p_Var24;
  uint uVar25;
  long lVar26;
  byte bVar27;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<unsigned_long> __l;
  __node_base_ptr local_c8 [2];
  _Storage<unsigned_long,_true> _Stack_b8;
  vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> values;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  changed_bits;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  index;
  Var *local_40;
  Var *var_local;
  Var *root;
  
  _Var19._M_value =
       op_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  if (((undefined1  [16])
       op_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    return;
  }
  puVar11 = (var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_40 = var;
  if (((long)(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)puVar11 == 4) && (*puVar11 == 1)) {
    VVar1 = var->type_;
    if (VVar1 != Slice) {
      if ((VVar1 == Parameter) || (VVar1 == ConstValue)) {
        pUVar16 = (UserException *)__cxa_allocate_exception(0x10);
        (*(local_40->super_IRNode)._vptr_IRNode[0x20])(&changed_bits._M_h._M_single_bucket);
        _Stack_b8 = (_Storage<unsigned_long,_true>)changed_bits._M_h._M_single_bucket;
        format_str.size_ = 0xd;
        format_str.data_ = (char *)0x21;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&_Stack_b8;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)
                   &values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (detail *)"Cannot set value for constant {0}",format_str,args);
        UserException::UserException
                  (pUVar16,(string *)
                           &values.
                            super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        __cxa_throw(pUVar16,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
      values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)&changed_bits._M_h._M_rehash_policy._M_next_resize;
      changed_bits._M_h._M_buckets = (__buckets_ptr)0x1;
      changed_bits._M_h._M_bucket_count = 0;
      changed_bits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      changed_bits._M_h._M_element_count._0_4_ = 0x3f800000;
      changed_bits._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      changed_bits._M_h._M_rehash_policy._4_4_ = 0;
      changed_bits._M_h._M_rehash_policy._M_next_resize = 0;
      uVar2 = (this->values_)._M_h._M_bucket_count;
      uVar20 = (ulong)var % uVar2;
      p_Var22 = (this->values_)._M_h._M_buckets[uVar20];
      p_Var23 = (__node_base_ptr)0x0;
      if ((p_Var22 != (__node_base_ptr)0x0) &&
         (p_Var3 = p_Var22->_M_nxt, p_Var23 = p_Var22, (Var *)p_Var22->_M_nxt[1]._M_nxt != var)) {
        while (p_Var22 = p_Var3, p_Var3 = p_Var22->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
          p_Var23 = (__node_base_ptr)0x0;
          if (((ulong)p_Var3[1]._M_nxt % uVar2 != uVar20) ||
             (p_Var23 = p_Var22, (Var *)p_Var3[1]._M_nxt == var)) goto LAB_001f5d4e;
        }
        p_Var23 = (__node_base_ptr)0x0;
      }
LAB_001f5d4e:
      if ((p_Var23 == (__node_base_ptr)0x0) || (p_Var23->_M_nxt == (_Hash_node_base *)0x0)) {
        p_Var13 = (_Storage<unsigned_long,_true> *)
                  std::__detail::
                  _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this,&local_40);
        p_Var13->_M_value = (unsigned_long)_Var19;
        uVar25 = 0;
        while( true ) {
          changed_bits._M_h._M_single_bucket =
               (__node_base_ptr)CONCAT44(changed_bits._M_h._M_single_bucket._4_4_,uVar25);
          uVar9 = (*(local_40->super_IRNode)._vptr_IRNode[7])();
          if (uVar9 <= uVar25) break;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<unsigned_int&>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&values.
                         super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                     &changed_bits._M_h._M_single_bucket);
          uVar25 = (int)changed_bits._M_h._M_single_bucket + 1;
        }
      }
      else {
        pmVar12 = std::__detail::
                  _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)this,&local_40);
        pvVar5 = (void *)*pmVar12;
        if (pvVar5 != (void *)_Var19._M_value) {
          p_Var13 = (_Storage<unsigned_long,_true> *)
                    std::__detail::
                    _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)this,&local_40);
          p_Var13->_M_value = (unsigned_long)_Var19;
          uVar25 = 0;
          while( true ) {
            changed_bits._M_h._M_single_bucket =
                 (__node_base_ptr)CONCAT44(changed_bits._M_h._M_single_bucket._4_4_,uVar25);
            uVar9 = (*(local_40->super_IRNode)._vptr_IRNode[7])();
            if (uVar9 <= uVar25) break;
            if ((((ulong)pvVar5 ^ _Var19._M_value) >>
                 ((ulong)changed_bits._M_h._M_single_bucket & 0x3f) & 1) != 0) {
              std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::_M_emplace<unsigned_int&>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)&values.
                             super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                         &changed_bits._M_h._M_single_bucket);
            }
            uVar25 = (int)changed_bits._M_h._M_single_bucket + 1;
          }
        }
      }
      trigger_event(this,local_40,
                    (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    iVar8 = (*(var->super_IRNode)._vptr_IRNode[0x28])(var);
    var_local = (Var *)CONCAT44(extraout_var,iVar8);
    _Stack_b8._M_value = 0;
    values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((var_local->type_ == Parameter) || (var_local->type_ == ConstValue)) {
      pUVar16 = (UserException *)__cxa_allocate_exception(0x10);
      (*(local_40->super_IRNode)._vptr_IRNode[0x20])(&changed_bits._M_h._M_single_bucket);
      local_c8[0] = changed_bits._M_h._M_single_bucket;
      format_str_00.size_ = 0xd;
      format_str_00.data_ = (char *)0x21;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_c8;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (detail *)"Cannot set value for constant {0}",format_str_00,args_00);
      UserException::UserException
                (pUVar16,(string *)
                         &values.
                          super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      __cxa_throw(pUVar16,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
    puVar11 = (var_local->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar4 = (var_local->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (((long)puVar4 - (long)puVar11 == 4) && (*puVar11 == 1)) {
      p_Var10 = std::
                _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::_M_find_before_node
                          ((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)this,(ulong)var_local % (this->values_)._M_h._M_bucket_count,
                           &var_local,(__hash_code)var_local);
      if ((p_Var10 == (__node_base_ptr)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0)) {
        pmVar12 = std::__detail::
                  _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this,&var_local);
        *pmVar12 = 0;
      }
      values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::__detail::
                    _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this,&var_local);
      std::vector<unsigned_long*,std::allocator<unsigned_long*>>::
      _M_assign_aux<unsigned_long*const*>
                ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)&_Stack_b8,
                 &values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      __n = 1;
      for (; iVar8 = (int)__n, puVar11 != puVar4; puVar11 = puVar11 + 1) {
        __n = (size_type)(iVar8 * *puVar11);
      }
      uVar2 = (this->complex_values_)._M_h._M_bucket_count;
      uVar20 = (ulong)var_local % uVar2;
      p_Var22 = (this->complex_values_)._M_h._M_buckets[uVar20];
      p_Var23 = (__node_base_ptr)0x0;
      if ((p_Var22 != (__node_base_ptr)0x0) &&
         (p_Var24 = p_Var22->_M_nxt, p_Var23 = p_Var22, var_local != (Var *)p_Var24[1]._M_nxt)) {
        while (p_Var3 = p_Var24->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
          p_Var23 = (__node_base_ptr)0x0;
          if (((ulong)p_Var3[1]._M_nxt % uVar2 != uVar20) ||
             (p_Var23 = p_Var24, p_Var24 = p_Var3, var_local == (Var *)p_Var3[1]._M_nxt))
          goto LAB_001f5e27;
        }
        p_Var23 = (__node_base_ptr)0x0;
      }
LAB_001f5e27:
      if ((p_Var23 == (__node_base_ptr)0x0) || (p_Var23->_M_nxt == (_Hash_node_base *)0x0)) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,__n,
                   (allocator_type *)&changed_bits._M_h._M_single_bucket);
        if (iVar8 != 0) {
          memset(values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,0,__n * 8);
        }
        std::
        _Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<kratos::Var_const*&,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                  ((_Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->complex_values_,&var_local,
                   &values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(values.
                          super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                          changed_bits._M_h._M_bucket_count -
                          (long)values.
                                super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      pmVar14 = std::__detail::
                _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&this->complex_values_,&var_local);
      std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::reserve
                ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)&_Stack_b8,__n);
      if (iVar8 != 0) {
        lVar26 = 0;
        do {
          values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)(pmVar14->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar26);
          std::vector<unsigned_long*,std::allocator<unsigned_long*>>::emplace_back<unsigned_long*>
                    ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)&_Stack_b8,
                     (unsigned_long **)
                     &values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          lVar26 = lVar26 + 8;
        } while (__n << 3 != lVar26);
      }
    }
    get_slice_index((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&changed_bits._M_h._M_single_bucket,this,local_40);
    if ((pointer)changed_bits._M_h._M_single_bucket ==
        index.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pIVar17 = (InternalException *)__cxa_allocate_exception(0x10);
      values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&changed_bits._M_h._M_bucket_count;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,"Empty slice","");
      InternalException::InternalException
                (pIVar17,(string *)
                         &values.
                          super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      __cxa_throw(pIVar17,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    pVar15 = compute_var_high_low
                       (var_local,
                        (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)&changed_bits._M_h._M_single_bucket);
    uVar25 = (*(var_local->super_IRNode)._vptr_IRNode[7])();
    if (uVar25 < (pVar15.first - pVar15.second) + 1) {
      pIVar17 = (InternalException *)__cxa_allocate_exception(0x10);
      values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&changed_bits._M_h._M_bucket_count;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 "Unable to resolve variable slicing","");
      InternalException::InternalException
                (pIVar17,(string *)
                         &values.
                          super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      __cxa_throw(pIVar17,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar25 = var_local->var_width_;
    uVar2 = ((ulong)pVar15 >> 0x20) / (ulong)uVar25;
    uVar9 = 0;
    cVar7 = (char)pVar15.first - (char)uVar25 * (char)uVar2;
    puVar6 = *(ulong **)(_Stack_b8._M_value + uVar2 * 8);
    bVar18 = (byte)(((ulong)pVar15 >> 0x20) % (ulong)uVar25);
    uVar2 = *puVar6;
    bVar27 = (cVar7 - bVar18) + 1;
    uVar20 = ((_Var19._M_value << (bVar27 & 0x3f)) >> (bVar27 & 0x3f)) << (bVar18 & 0x3f) |
             ~((0xffffffffffffffffU >> (cVar7 + 1U & 0x3f)) >> (bVar18 & 0x3f)) & uVar2;
    *puVar6 = uVar20;
    if (uVar20 != uVar2) {
      values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)&changed_bits._M_h._M_rehash_policy._M_next_resize;
      changed_bits._M_h._M_buckets = (__buckets_ptr)0x1;
      changed_bits._M_h._M_bucket_count = 0;
      changed_bits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      changed_bits._M_h._M_element_count._0_4_ = 0x3f800000;
      changed_bits._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      changed_bits._M_h._M_rehash_policy._4_4_ = 0;
      changed_bits._M_h._M_rehash_policy._M_next_resize = 0;
      uVar20 = *puVar6;
      while( true ) {
        local_c8[0] = (__node_base_ptr)CONCAT44(local_c8[0]._4_4_,uVar9);
        uVar25 = (*(var_local->super_IRNode)._vptr_IRNode[7])();
        if (uVar25 <= uVar9) break;
        if (((uVar2 ^ uVar20) >> ((ulong)local_c8[0] & 0x3f) & 1) != 0) {
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<unsigned_int&>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&values.
                         super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,local_c8);
        }
        uVar9 = (int)local_c8[0] + 1;
      }
      trigger_event(this,var_local,
                    (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (changed_bits._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      operator_delete(changed_bits._M_h._M_single_bucket,
                      (long)index.
                            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)changed_bits._M_h._M_single_bucket);
    }
    ppuVar21 = values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    _Var19 = _Stack_b8;
    if ((void *)_Stack_b8._M_value == (void *)0x0) {
      return;
    }
  }
  else {
    __l._M_len = 1;
    __l._M_array = (iterator)&_Stack_b8;
    _Stack_b8._M_value = _Var19._M_value;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &changed_bits._M_h._M_single_bucket,__l,(allocator_type *)local_c8);
    values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)changed_bits._M_h._M_single_bucket;
    changed_bits._M_h._M_buckets =
         (__buckets_ptr)
         index.
         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    changed_bits._M_h._M_bucket_count =
         (size_type)
         index.
         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    changed_bits._M_h._M_single_bucket = (__node_base_ptr)0x0;
    changed_bits._M_h._M_before_begin._M_nxt._0_1_ = 1;
    set_complex_value_(this,var,(optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)&values.
                                    super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (((char)changed_bits._M_h._M_before_begin._M_nxt == '\x01') &&
       (changed_bits._M_h._M_before_begin._M_nxt =
             changed_bits._M_h._M_before_begin._M_nxt & 0xffffffffffffff00,
       values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
      operator_delete(values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      changed_bits._M_h._M_bucket_count -
                      (long)values.
                            super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (changed_bits._M_h._M_single_bucket == (__node_base_ptr)0x0) {
      return;
    }
    ppuVar21 = (pointer)0x0;
    _Var19 = (_Storage<unsigned_long,_true>)changed_bits._M_h._M_single_bucket;
  }
  operator_delete((void *)_Var19,(long)ppuVar21 - (long)_Var19);
  return;
}

Assistant:

void Simulator::set_value_(const kratos::Var *var, std::optional<uint64_t> op_value) {
    if (!op_value) return;
    auto value = *op_value;
    if (var->size().size() != 1 || var->size().front() != 1) {
        set_complex_value_(var, std::vector<uint64_t>{value});
        return;
    }
    if (var->type() == VarType::Parameter || var->type() == VarType::ConstValue) {
        throw UserException(::format("Cannot set value for constant {0}", var->handle_name()));
    } else if (var->type() == VarType::Slice) {
        auto const *root = var->get_var_root_parent();
        std::vector<uint64_t *> values;
        if (root->type() == VarType::ConstValue || root->type() == VarType::Parameter) {
            throw UserException(::format("Cannot set value for constant {0}", var->handle_name()));
        } else if (root->size().size() == 1 && root->size().front() == 1) {
            // this is size one
            if (values_.find(root) == values_.end()) values_[root] = 0;
            values = {&values_.at(root)};
        } else {
            uint32_t base = 1;
            for (uint32_t s : root->size()) {
                base *= s;
            }
            if (complex_values_.find(root) == complex_values_.end()) {
                // fill in values
                std::vector<uint64_t> v(base);
                for (uint64_t i = 0; i < base; i++) v[i] = 0;
                complex_values_.emplace(root, v);
            }
            std::vector<uint64_t> &v_ref = complex_values_.at(root);
            values.reserve(base);
            for (uint64_t i = 0; i < base; i++) values.emplace_back(&v_ref[i]);
        }
        // obtain the index
        auto index = get_slice_index(var);
        if (index.empty()) throw InternalException("Empty slice");
        auto [var_high, var_low] = compute_var_high_low(root, index);
        if (var_high + 1 - var_low > root->width())
            throw InternalException("Unable to resolve variable slicing");
        auto base = var_low / root->var_width();
        var_high = var_high - base * root->var_width();
        var_low = var_low - base * root->var_width();
        auto *v = values[base];
        auto temp = *v;
        // compute the mask
        uint64_t mask = (0xFFFFFFFFFFFFFFFF >> (var_high + 1)) >> var_low;
        *v = *v & (~mask);
        value = value & (0xFFFFFFFFFFFFFFFF >> (var_high - var_low + 1));
        *v = *v | (value << var_low);
        if (*v != temp) {
            std::unordered_set<uint32_t> changed_bits;
            uint64_t m = (*v) ^ temp;
            for (uint32_t bit = 0; bit < root->width(); bit++) {
                if ((m >> bit) & 1u) {
                    changed_bits.emplace(bit);
                }
            }
            trigger_event(root, changed_bits);
        }
    } else {
        std::unordered_set<uint32_t> changed_bits;
        if (values_.find(var) != values_.end()) {
            auto temp = values_.at(var);
            if (temp != value) {
                values_[var] = value;
                uint64_t m = value ^ temp;
                for (uint32_t bit = 0; bit < var->width(); bit++) {
                    if ((m >> bit) & 1u) {
                        changed_bits.emplace(bit);
                    }
                }
            }
        } else {
            values_[var] = value;
            for (uint32_t i = 0; i < var->width(); i++) changed_bits.emplace(i);
        }
        trigger_event(var, changed_bits);
    }
}